

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# res0.c
# Opt level: O0

vorbis_look_residue * res0_look(vorbis_dsp_state *vd,vorbis_info_residue *vr)

{
  int iVar1;
  int iVar2;
  undefined8 *puVar3;
  void *pvVar4;
  void *pvVar5;
  long lVar6;
  long deco;
  long mult;
  long val;
  int stages;
  int maxstage;
  int dim;
  int acc;
  int k;
  int j;
  codec_setup_info *ci;
  vorbis_look_residue0 *look;
  vorbis_info_residue0 *info;
  vorbis_info_residue *vr_local;
  vorbis_dsp_state *vd_local;
  
  puVar3 = (undefined8 *)calloc(1,0x50);
  pvVar5 = vd->vi->codec_setup;
  maxstage = 0;
  val._4_4_ = 0;
  *puVar3 = vr;
  *(undefined4 *)(puVar3 + 1) = *(undefined4 *)((long)vr + 0x14);
  puVar3[2] = *(undefined8 *)((long)pvVar5 + 0x1328);
  puVar3[3] = *(long *)((long)pvVar5 + 0x1328) + (long)*(int *)((long)vr + 0x1c) * 0x60;
  iVar1 = (int)*(undefined8 *)puVar3[3];
  pvVar4 = calloc((long)*(int *)(puVar3 + 1),8);
  puVar3[4] = pvVar4;
  for (acc = 0; acc < *(int *)(puVar3 + 1); acc = acc + 1) {
    iVar2 = ov_ilog(*(ogg_uint32_t *)((long)vr + (long)acc * 4 + 0x20));
    if (iVar2 != 0) {
      if (val._4_4_ < iVar2) {
        val._4_4_ = iVar2;
      }
      pvVar4 = calloc((long)iVar2,8);
      *(void **)(puVar3[4] + (long)acc * 8) = pvVar4;
      for (dim = 0; dim < iVar2; dim = dim + 1) {
        if ((*(uint *)((long)vr + (long)acc * 4 + 0x20) & 1 << ((byte)dim & 0x1f)) != 0) {
          *(long *)(*(long *)(puVar3[4] + (long)acc * 8) + (long)dim * 8) =
               *(long *)((long)pvVar5 + 0x1328) +
               (long)*(int *)((long)vr + (long)maxstage * 4 + 0x120) * 0x60;
          maxstage = maxstage + 1;
        }
      }
    }
  }
  *(undefined4 *)(puVar3 + 5) = 1;
  for (acc = 0; acc < iVar1; acc = acc + 1) {
    *(int *)(puVar3 + 5) = *(int *)(puVar3 + 1) * *(int *)(puVar3 + 5);
  }
  *(int *)((long)puVar3 + 0xc) = val._4_4_;
  pvVar5 = malloc((long)*(int *)(puVar3 + 5) << 3);
  puVar3[6] = pvVar5;
  for (acc = 0; acc < *(int *)(puVar3 + 5); acc = acc + 1) {
    mult = (long)acc;
    deco = (long)(*(int *)(puVar3 + 5) / *(int *)(puVar3 + 1));
    pvVar5 = malloc((long)iVar1 << 2);
    *(void **)(puVar3[6] + (long)acc * 8) = pvVar5;
    for (dim = 0; dim < iVar1; dim = dim + 1) {
      lVar6 = mult / deco;
      mult = mult - lVar6 * deco;
      deco = deco / (long)*(int *)(puVar3 + 1);
      *(int *)(*(long *)(puVar3[6] + (long)acc * 8) + (long)dim * 4) = (int)lVar6;
    }
  }
  return puVar3;
}

Assistant:

vorbis_look_residue *res0_look(vorbis_dsp_state *vd,
                               vorbis_info_residue *vr){
  vorbis_info_residue0 *info=(vorbis_info_residue0 *)vr;
  vorbis_look_residue0 *look=_ogg_calloc(1,sizeof(*look));
  codec_setup_info     *ci=vd->vi->codec_setup;

  int j,k,acc=0;
  int dim;
  int maxstage=0;
  look->info=info;

  look->parts=info->partitions;
  look->fullbooks=ci->fullbooks;
  look->phrasebook=ci->fullbooks+info->groupbook;
  dim=look->phrasebook->dim;

  look->partbooks=_ogg_calloc(look->parts,sizeof(*look->partbooks));

  for(j=0;j<look->parts;j++){
    int stages=ov_ilog(info->secondstages[j]);
    if(stages){
      if(stages>maxstage)maxstage=stages;
      look->partbooks[j]=_ogg_calloc(stages,sizeof(*look->partbooks[j]));
      for(k=0;k<stages;k++)
        if(info->secondstages[j]&(1<<k)){
          look->partbooks[j][k]=ci->fullbooks+info->booklist[acc++];
#ifdef TRAIN_RES
          look->training_data[k][j]=_ogg_calloc(look->partbooks[j][k]->entries,
                                           sizeof(***look->training_data));
#endif
        }
    }
  }

  look->partvals=1;
  for(j=0;j<dim;j++)
      look->partvals*=look->parts;

  look->stages=maxstage;
  look->decodemap=_ogg_malloc(look->partvals*sizeof(*look->decodemap));
  for(j=0;j<look->partvals;j++){
    long val=j;
    long mult=look->partvals/look->parts;
    look->decodemap[j]=_ogg_malloc(dim*sizeof(*look->decodemap[j]));
    for(k=0;k<dim;k++){
      long deco=val/mult;
      val-=deco*mult;
      mult/=look->parts;
      look->decodemap[j][k]=deco;
    }
  }
#if defined(TRAIN_RES) || defined (TRAIN_RESAUX)
  {
    static int train_seq=0;
    look->train_seq=train_seq++;
  }
#endif
  return(look);
}